

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.cpp
# Opt level: O2

void __thiscall
WordSplitNTest_random_vector_Test<char32_t>::TestBody
          (WordSplitNTest_random_vector_Test<char32_t> *this)

{
  char *pcVar1;
  long lVar2;
  unsigned_long local_e8;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar;
  vector<std::vector<char32_t,_std::allocator<char32_t>_>,_std::allocator<std::vector<char32_t,_std::allocator<char32_t>_>_>_>
  split_result;
  RandomWordTestData<char32_t,_std::vector<char32_t,_std::allocator<char32_t>_>_> data;
  
  RandomWordTestData<char32_t,_std::vector<char32_t,_std::allocator<char32_t>_>_>::
  RandomWordTestData(&data,L'\0',0,0);
  jessilib::
  word_split_n<std::vector,_std::vector<char32_t,_std::allocator<char32_t>_>,_std::vector<char32_t,_std::allocator<char32_t>_>_>
            (&split_result,&data.m_str,L'\0',4);
  gtest_ar_2._0_8_ =
       ((long)split_result.
              super__Vector_base<std::vector<char32_t,_std::allocator<char32_t>_>,_std::allocator<std::vector<char32_t,_std::allocator<char32_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
       (long)split_result.
             super__Vector_base<std::vector<char32_t,_std::allocator<char32_t>_>,_std::allocator<std::vector<char32_t,_std::allocator<char32_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  local_e8 = 5;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"split_result.size()","n + 1",(unsigned_long *)&gtest_ar_2,
             &local_e8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0xb3,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
    if (gtest_ar_2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  for (lVar2 = 0; lVar2 != 0x60; lVar2 = lVar2 + 0x18) {
    testing::internal::
    CmpHelperEQ<std::vector<char32_t,std::allocator<char32_t>>,std::vector<char32_t,std::allocator<char32_t>>>
              ((internal *)&gtest_ar,"split_result[index]","data.m_tokens[index]",
               (vector<char32_t,_std::allocator<char32_t>_> *)
               ((long)&((split_result.
                         super__Vector_base<std::vector<char32_t,_std::allocator<char32_t>_>,_std::allocator<std::vector<char32_t,_std::allocator<char32_t>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<char32_t,_std::allocator<char32_t>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar2),
               (vector<char32_t,_std::allocator<char32_t>_> *)
               ((long)&((data.m_tokens.
                         super__Vector_base<std::vector<char32_t,_std::allocator<char32_t>_>,_std::allocator<std::vector<char32_t,_std::allocator<char32_t>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<char32_t,_std::allocator<char32_t>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar2));
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_2);
      pcVar1 = "";
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar1 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
                 ,0xb5,pcVar1);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&gtest_ar_2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
      if (gtest_ar_2._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_2._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
  }
  RandomWordTestData<char32_t,_std::vector<char32_t,_std::allocator<char32_t>_>_>::get_remainder
            ((vector<char32_t,_std::allocator<char32_t>_> *)&gtest_ar,&data,4);
  testing::internal::
  CmpHelperEQ<std::vector<char32_t,std::allocator<char32_t>>,std::vector<char32_t,std::allocator<char32_t>>>
            ((internal *)&gtest_ar_2,"split_result[n]","data.get_remainder(n)",
             split_result.
             super__Vector_base<std::vector<char32_t,_std::allocator<char32_t>_>,_std::allocator<std::vector<char32_t,_std::allocator<char32_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 4,
             (vector<char32_t,_std::allocator<char32_t>_> *)&gtest_ar);
  std::_Vector_base<char32_t,_std::allocator<char32_t>_>::~_Vector_base
            ((_Vector_base<char32_t,_std::allocator<char32_t>_> *)&gtest_ar);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar_2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0xb8,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
    if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_2.message_);
  std::
  vector<std::vector<char32_t,_std::allocator<char32_t>_>,_std::allocator<std::vector<char32_t,_std::allocator<char32_t>_>_>_>
  ::~vector(&split_result);
  RandomWordTestData<char32_t,_std::vector<char32_t,_std::allocator<char32_t>_>_>::
  ~RandomWordTestData(&data);
  return;
}

Assistant:

TYPED_TEST(WordSplitNTest, random_vector) {
	RandomWordTestData<TypeParam, std::vector<TypeParam>> data{};
	constexpr size_t n = 4;
	std::vector<std::vector<TypeParam>> split_result = word_split_n<std::vector, std::vector<TypeParam>>(data.m_str, default_delim<TypeParam>, n);

	// Tokens shall be same up until last one (n + 1)
	EXPECT_EQ(split_result.size(), n + 1);
	for (size_t index = 0; index != n; ++index) {
		EXPECT_EQ(split_result[index], data.m_tokens[index]);
	}

	EXPECT_EQ(split_result[n], data.get_remainder(n));
}